

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

Excluded s2pred::TriageVoronoiSiteExclusion<double>
                   (Vector3<double> *a,Vector3<double> *b,Vector3<double> *x0,Vector3<double> *x1,
                   double r2)

{
  ostream *poVar1;
  __type_conflict _Var2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int local_2e0;
  int local_2dc;
  S2LogMessage local_270;
  S2LogMessageVoidify local_259;
  int local_258;
  int local_254;
  int cb;
  int ca;
  double local_248;
  double r90;
  double cos_d_error;
  double cos_d;
  double result_error;
  double result;
  double sin_d_error;
  double sin_d;
  double aXb1;
  D local_1f0;
  undefined1 local_1d8 [8];
  Vector3<double> aXb;
  double lhs3_error;
  double abs_lhs3;
  double lhs3;
  double rb_error;
  double rb;
  double min_rb2;
  double rb2_error;
  double rb2;
  double bDn_error;
  double bDn2;
  D local_158;
  double local_140;
  double bDn;
  double bx2;
  double ra_error;
  double ra;
  double min_ra2;
  double ra2_error;
  double ra2;
  double aDn_error;
  double aDn2;
  D local_e0;
  double local_c8;
  double aDn;
  double ax2;
  double n2sin2_r;
  double sin2_r;
  double cos_r;
  double Dn_error;
  double n1;
  double n2;
  D local_70;
  undefined1 local_58 [8];
  Vector3<double> n;
  double T_ERR;
  double r2_local;
  Vector3<double> *x1_local;
  Vector3<double> *x0_local;
  Vector3<double> *b_local;
  Vector3<double> *a_local;
  
  n.c_[2] = 1.1102230246251565e-16;
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            (&local_70,(BasicVector<Vector3,_double,_3UL> *)x0,x1);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
            ((D *)&n2,(BasicVector<Vector3,_double,_3UL> *)x0,x1);
  Vector3<double>::CrossProd((Vector3<double> *)local_58,&local_70,(Vector3<double> *)&n2);
  n1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                 ((BasicVector<Vector3,_double,_3UL> *)local_58);
  Dn_error = sqrt(n1);
  _Var2 = std::sqrt<int>(3);
  dVar3 = (_Var2 * 2.0 + 3.5) * Dn_error;
  _Var2 = std::sqrt<int>(3);
  cos_r = (dVar3 + _Var2 * 32.0 * 1.1102230246251565e-16) * 1.1102230246251565e-16;
  sin2_r = 1.0 - r2 * 0.5;
  n2sin2_r = r2 * (1.0 - r2 * 0.25);
  ax2 = n1 * n2sin2_r;
  GetClosestVertex<double>((Vector3<double> *)&aDn2,a,x0,x1,&aDn);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            (&local_e0,(BasicVector<Vector3,_double,_3UL> *)a,(D *)&aDn2);
  local_c8 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                       ((BasicVector<Vector3,_double,_3UL> *)&local_e0,(D *)local_58);
  dVar3 = cos_r;
  aDn_error = local_c8 * local_c8;
  dVar4 = sqrt(aDn);
  ra2 = dVar3 * dVar4;
  ra2_error = ax2 - aDn_error;
  min_ra2 = aDn_error * 1.3322676295501878e-15 + (ABS(local_c8) * 2.0 + ra2) * ra2 +
            ax2 * 6.661338147750939e-16;
  ra = ra2_error - min_ra2;
  if (0.0 <= ra) {
    ra_error = sqrt(ra2_error);
    dVar3 = ra_error * 1.6653345369377348e-16;
    dVar4 = min_ra2 * 0.5;
    dVar5 = sqrt(ra);
    bx2 = dVar3 + dVar4 / dVar5;
    GetClosestVertex<double>((Vector3<double> *)&bDn2,b,x0,x1,&bDn);
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
              (&local_158,(BasicVector<Vector3,_double,_3UL> *)b,(D *)&bDn2);
    local_140 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                          ((BasicVector<Vector3,_double,_3UL> *)&local_158,(D *)local_58);
    dVar3 = cos_r;
    dVar4 = local_140 * local_140;
    dVar5 = sqrt(bDn);
    dVar3 = dVar3 * dVar5;
    dVar5 = ax2 - dVar4;
    dVar4 = dVar4 * 1.3322676295501878e-15 + (ABS(local_140) * 2.0 + dVar3) * dVar3 +
            ax2 * 6.661338147750939e-16;
    dVar6 = dVar5 - dVar4;
    if (0.0 <= dVar6) {
      dVar5 = sqrt(dVar5);
      dVar6 = sqrt(dVar6);
      dVar7 = sin2_r * (dVar5 - ra_error);
      dVar8 = ABS(dVar7);
      aXb.c_[2] = sin2_r * (bx2 + dVar5 * 1.6653345369377348e-16 + (dVar4 * 0.5) / dVar6) +
                  dVar8 * 3.3306690738754696e-16;
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
                (&local_1f0,(BasicVector<Vector3,_double,_3UL> *)a,b);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
                ((D *)&aXb1,(BasicVector<Vector3,_double,_3UL> *)a,b);
      Vector3<double>::CrossProd((Vector3<double> *)local_1d8,&local_1f0,(Vector3<double> *)&aXb1);
      sin_d = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                        ((BasicVector<Vector3,_double,_3UL> *)local_1d8);
      dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                        ((BasicVector<Vector3,_double,_3UL> *)local_1d8,(D *)local_58);
      sin_d_error = dVar4 * 0.5;
      _Var2 = std::sqrt<int>(3);
      dVar4 = ((_Var2 * 2.0 + 2.5) * 1.1102230246251565e-16 + 4.440892098500626e-16) * sin_d *
              Dn_error;
      _Var2 = std::sqrt<int>(3);
      result = dVar4 + _Var2 * 16.0 * 1.1102230246251565e-16 * 1.1102230246251565e-16 *
                       (sin_d + Dn_error);
      result_error = dVar8 - sin_d_error;
      cos_d = aXb.c_[2] + result;
      if (-cos_d <= result_error) {
        dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                          ((BasicVector<Vector3,_double,_3UL> *)a,b);
        cos_d_error = dVar4 * n1 - local_c8 * local_140;
        r90 = (ABS(local_c8) * 1.4432899320127035e-15 + ra2) * ABS(local_140) +
              (ABS(local_c8) + ra2) * dVar3 + n1 * 1.7763568394002505e-15;
        if (-r90 < cos_d_error) {
          if (r90 <= cos_d_error) {
            if (-result <= sin_d_error) {
              if (sin_d_error <= result) {
                return UNCERTAIN;
              }
            }
            else {
              _cb = S1ChordAngle::Right();
              local_248 = S1ChordAngle::length2((S1ChordAngle *)&cb);
              if (-aXb.c_[2] <= dVar7) {
                local_2dc = TriageCompareCosDistance<double>(a,x0,local_248);
              }
              else {
                local_2dc = -1;
              }
              local_254 = local_2dc;
              if (dVar7 <= aXb.c_[2]) {
                local_2e0 = TriageCompareCosDistance<double>(b,x1,local_248);
              }
              else {
                local_2e0 = -1;
              }
              local_258 = local_2e0;
              if ((local_254 < 0) && (local_2e0 < 0)) {
                return NEITHER;
              }
              if ((local_254 < 1) && (local_2e0 < 1)) {
                return UNCERTAIN;
              }
              if (dVar8 <= aXb.c_[2]) {
                return UNCERTAIN;
              }
            }
            if (cos_d < result_error) {
              if (dVar8 <= aXb.c_[2]) {
                S2FatalLogMessage::S2FatalLogMessage
                          ((S2FatalLogMessage *)&local_270,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                           ,0x4f4,kFatal,(ostream *)&std::cerr);
                poVar1 = S2LogMessage::stream(&local_270);
                poVar1 = std::operator<<(poVar1,"Check failed: (abs_lhs3) > (lhs3_error) ");
                S2LogMessageVoidify::operator&(&local_259,poVar1);
                S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_270);
              }
              a_local._4_4_ = (Excluded)(dVar7 <= 0.0);
            }
            else {
              a_local._4_4_ = UNCERTAIN;
            }
          }
          else {
            a_local._4_4_ = UNCERTAIN;
          }
        }
        else {
          a_local._4_4_ = NEITHER;
        }
      }
      else {
        a_local._4_4_ = NEITHER;
      }
    }
    else {
      a_local._4_4_ = UNCERTAIN;
    }
  }
  else {
    a_local._4_4_ = UNCERTAIN;
  }
  return a_local._4_4_;
}

Assistant:

Excluded TriageVoronoiSiteExclusion(const Vector3<T>& a, const Vector3<T>& b,
                                    const Vector3<T>& x0, const Vector3<T>& x1,
                                    T r2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // Define the "coverage disc" of a site S to be the disc centered at S with
  // radius r (i.e., squared chord angle length r2).  Similarly, define the
  // "coverage interval" of S along an edge X to be the intersection of X with
  // the coverage disc of S.  The coverage interval can be represented as the
  // point at the center of the interval and an angle that measures the
  // semi-width or "radius" of the interval.
  //
  // To test whether site A excludes site B along the input edge X, we test
  // whether the coverage interval of A contains the coverage interval of B.
  // Let "ra" and "rb" be the radii (semi-widths) of the two intervals, and
  // let "d" be the angle between their center points.  Then "a" properly
  // contains "b" if (ra - rb > d), and "b" contains "a" if (rb - ra > d).
  // Note that only one of these conditions can be true.  Therefore we can
  // determine whether one site excludes the other by checking whether
  //
  // (1)   |rb - ra| > d
  //
  // and use the sign of (rb - ra) to determine which site is excluded.
  //
  // The actual code is based on the following.  Let A1 and B1 be the unit
  // vectors A and B scaled by cos(r) (these points are inside the sphere).
  // The planes perpendicular to OA1 and OA2 cut off two discs of radius r
  // around A and B.  Now consider the two lines (inside the sphere) where
  // these planes intersect the plane containing the input edge X, and let A2
  // and B2 be the points on these lines that are closest to A and B.  The
  // coverage intervals of A and B can be represented as an interval along
  // each of these lines, centered at A2 and B2.  Let P1 and P2 be the
  // endpoints of the coverage interval for A, and let Q1 and Q2 be the
  // endpoints of the coverage interval for B.  We can view each coverage
  // interval as either a chord through the sphere's interior, or as a segment
  // of the original edge X (by projecting the chord onto the sphere's
  // surface).
  //
  // To check whether B's interval is contained by A's interval, we test
  // whether both endpoints of B's interval (Q1 and Q2) are contained by A's
  // interval.  E.g., we could test whether Qi.DotProd(A2) > A2.Norm2().
  //
  // However rather than constructing the actual points A1, A2, and so on, it
  // turns out to be more efficient to compute the sines and cosines
  // ("components") of the various angles and then use trigonometric
  // identities.  Predicate (1) can be expressed as
  //
  //      |sin(rb - ra)| > sin(d)
  //
  // provided that |d| <= Pi/2 (which must be checked), and then expanded to
  //
  // (2)  |sin(rb) cos(ra) - sin(ra) cos(rb)| > sin(d) .
  //
  // The components of the various angles can be expressed using dot and cross
  // products based on the construction above:
  //
  //   sin(ra) = sqrt(sin^2(r) |a|^2 |n|^2 - |a.n|^2) / |aXn|
  //   cos(ra) = cos(r) |a| |n| / |aXn|
  //   sin(rb) = sqrt(sin^2(r) |b|^2 |n|^2 - |b.n|^2) / |bXn|
  //   cos(rb) = cos(r) |b| |n| / |bXn|
  //   sin(d)  = (aXb).n |n| / (|aXn| |bXn|)
  //   cos(d)  = (aXn).(bXn) / (|aXn| |bXn|)
  //
  // Also, the squared chord length r2 is equal to 4 * sin^2(r / 2), which
  // yields the following relationships:
  //
  //   sin(r)  = sqrt(r2 (1 - r2 / 4))
  //   cos(r)  = 1 - r2 / 2
  //
  // We then scale both sides of (2) by |aXn| |bXn| / |n| (in order to
  // minimize the number of calculations and to avoid divisions), which gives:
  //
  //    cos(r) ||a| sqrt(sin^2(r) |b|^2 |n|^2 - |b.n|^2) -
  //            |b| sqrt(sin^2(r) |a|^2 |n|^2 - |a.n|^2)| > (aXb).n
  //
  // Furthermore we can substitute |a| = |b| = 1 (as long as this is taken
  // into account in the error bounds), yielding
  //
  // (3)   cos(r) |sqrt(sin^2(r) |n|^2 - |b.n|^2) -
  //               sqrt(sin^2(r) |n|^2 - |a.n|^2)| > (aXb).n
  //
  // The code below is more complicated than this because many expressions
  // have been modified for better numerical stability.  For example, dot
  // products between unit vectors are computed using (x - y).DotProd(x + y),
  // and the dot product between a point P and the normal N of an edge X is
  // measured using (P - Xi).DotProd(N) where Xi is the endpoint of X that is
  // closer to P.

  Vector3<T> n = (x0 - x1).CrossProd(x0 + x1);  // 2 * x0.CrossProd(x1)
  T n2 = n.Norm2();
  T n1 = sqrt(n2);
  // This factor is used in the error terms of dot products with "n" below.
  T Dn_error = ((3.5 + 2 * sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;

  T cos_r = 1 - 0.5 * r2;
  T sin2_r = r2 * (1 - 0.25 * r2);
  T n2sin2_r = n2 * sin2_r;

  // "ra" and "rb" denote sin(ra) and sin(rb) after the scaling above.
  T ax2, aDn = (a - GetClosestVertex(a, x0, x1, &ax2)).DotProd(n);
  T aDn2 = aDn * aDn;
  T aDn_error = Dn_error * sqrt(ax2);
  T ra2 = n2sin2_r - aDn2;
  T ra2_error = (8 * DBL_ERR + 4 * T_ERR) * aDn2 +
      (2 * fabs(aDn) + aDn_error) * aDn_error + 6 * T_ERR * n2sin2_r;
  // This is the minimum possible value of ra2, which is used to bound the
  // derivative of sqrt(ra2) in computing ra_error below.
  T min_ra2 = ra2 - ra2_error;
  if (min_ra2 < 0) return Excluded::UNCERTAIN;
  T ra = sqrt(ra2);
  // Includes the ra2 subtraction error above.
  T ra_error = 1.5 * T_ERR * ra + 0.5 * ra2_error / sqrt(min_ra2);

  T bx2, bDn = (b - GetClosestVertex(b, x0, x1, &bx2)).DotProd(n);
  T bDn2 = bDn * bDn;
  T bDn_error = Dn_error * sqrt(bx2);
  T rb2 = n2sin2_r - bDn2;
  T rb2_error = (8 * DBL_ERR + 4 * T_ERR) * bDn2 +
      (2 * fabs(bDn) + bDn_error) * bDn_error + 6 * T_ERR * n2sin2_r;
  T min_rb2 = rb2 - rb2_error;
  if (min_rb2 < 0) return Excluded::UNCERTAIN;
  T rb = sqrt(rb2);
  // Includes the rb2 subtraction error above.
  T rb_error = 1.5 * T_ERR * rb + 0.5 * rb2_error / sqrt(min_rb2);

  // The sign of LHS(3) determines which site may be excluded by the other.
  T lhs3 = cos_r * (rb - ra);
  T abs_lhs3 = fabs(lhs3);
  T lhs3_error = cos_r * (ra_error + rb_error) + 3 * T_ERR * abs_lhs3;

  // Now we evaluate the RHS of (3), which is proportional to sin(d).
  Vector3<T> aXb = (a - b).CrossProd(a + b);  // 2 * a.CrossProd(b)
  T aXb1 = aXb.Norm();
  T sin_d = 0.5 * aXb.DotProd(n);
  T sin_d_error = (4 * DBL_ERR + (2.5 + 2 * sqrt(3)) * T_ERR) * aXb1 * n1 +
      16 * sqrt(3) * DBL_ERR * T_ERR * (aXb1 + n1);

  // If LHS(3) is definitely less than RHS(3), neither site excludes the other.
  T result = abs_lhs3 - sin_d;
  T result_error = lhs3_error + sin_d_error;
  if (result < -result_error) return Excluded::NEITHER;

  // Otherwise, before proceeding further we need to check that |d| <= Pi/2.
  // In fact, |d| < Pi/2 is enough because of the requirement that r < Pi/2.
  // The following expression represents cos(d) after scaling; it is
  // equivalent to (aXn).(bXn) but has about 30% less error.
  T cos_d = a.DotProd(b) * n2 - aDn * bDn;
  T cos_d_error =
      ((8 * DBL_ERR + 5 * T_ERR) * fabs(aDn) + aDn_error) * fabs(bDn) +
      (fabs(aDn) + aDn_error) * bDn_error + (8 * DBL_ERR + 8 * T_ERR) * n2;
  if (cos_d <= -cos_d_error) return Excluded::NEITHER;

  // Potential optimization: if the sign of cos(d) is uncertain, then instead
  // we could check whether cos(d) >= cos(r).  Unfortunately this is fairly
  // expensive since it requires computing denominator |aXn||bXn| of cos(d)
  // and the associated error bounds.  In any case this case is relatively
  // rare so it seems better to punt.
  if (cos_d < cos_d_error) return Excluded::UNCERTAIN;

  // Normally we have d > 0 because the sites are sorted so that A is closer
  // to X0 and B is closer to X1.  However if the edge X is longer than Pi/2,
  // and the sites A and B are beyond its endpoints, then AB can wrap around
  // the sphere in the opposite direction from X.  In this situation d < 0 but
  // each site is closest to one endpoint of X, so neither excludes the other.
  //
  // It turns out that this can happen only when the site that is further away
  // from edge X is less than 90 degrees away from whichever endpoint of X it
  // is closer to.  It is provable that if this distance is less than 90
  // degrees, then it is also less than r2, and therefore the Voronoi regions
  // of both sites intersect the edge.
  if (sin_d < -sin_d_error) {
    T r90 = S1ChordAngle::Right().length2();
    // "ca" is negative if Voronoi region A definitely intersects edge X.
    int ca = (lhs3 < -lhs3_error) ? -1 : TriageCompareCosDistance(a, x0, r90);
    int cb = (lhs3 > lhs3_error) ? -1 : TriageCompareCosDistance(b, x1, r90);
    if (ca < 0 && cb < 0) return Excluded::NEITHER;
    if (ca <= 0 && cb <= 0) return Excluded::UNCERTAIN;
    if (abs_lhs3 <= lhs3_error) return Excluded::UNCERTAIN;
  } else if (sin_d <= sin_d_error) {
    return Excluded::UNCERTAIN;
  }
  // Now we can finish checking the results of predicate (3).
  if (result <= result_error) return Excluded::UNCERTAIN;
  S2_DCHECK_GT(abs_lhs3, lhs3_error);
  return (lhs3 > 0) ? Excluded::FIRST : Excluded::SECOND;
}